

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data_Query_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Data_Query_PDU::Data_Query_PDU
          (Data_Query_PDU *this,EntityIdentifier *OriginatingEntityID,
          EntityIdentifier *ReceivingEntityID,KUINT32 RequestID)

{
  KUINT32 RequestID_local;
  EntityIdentifier *ReceivingEntityID_local;
  EntityIdentifier *OriginatingEntityID_local;
  Data_Query_PDU *this_local;
  
  Simulation_Management_Header::Simulation_Management_Header
            (&this->super_Simulation_Management_Header,OriginatingEntityID,ReceivingEntityID);
  (this->super_Simulation_Management_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Data_Query_PDU_0032be48;
  this->m_ui32RequestID = RequestID;
  DATA_TYPE::TimeStamp::TimeStamp(&this->m_TimeInterval);
  this->m_ui32NumFixedDatum = 0;
  this->m_ui32NumVariableDatum = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_vFixedDatum);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_vVariableDatum);
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui8PDUType = '\x12';
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui16PDULength = 0x28;
  return;
}

Assistant:

Data_Query_PDU::Data_Query_PDU( const EntityIdentifier & OriginatingEntityID, const EntityIdentifier & ReceivingEntityID,
                                KUINT32 RequestID ):
    Simulation_Management_Header( OriginatingEntityID, ReceivingEntityID ),
    m_ui32RequestID( RequestID ),
    m_ui32NumFixedDatum( 0 ),
    m_ui32NumVariableDatum( 0 )
{
    m_ui8PDUType = Data_Query_PDU_Type;
    m_ui16PDULength = DATA_QUERY_PDU_SIZE;
}